

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed64
          (UnknownFieldLiteParserHelper *this,uint32 num,uint64 value)

{
  uint64 in_RDX;
  string *in_RDI;
  char buffer [8];
  uint64 in_stack_ffffffffffffffe0;
  
  if (*(long *)in_RDI != 0) {
    WriteVarint(in_stack_ffffffffffffffe0,in_RDI);
    io::CodedOutputStream::WriteLittleEndian64ToArray(in_RDX,&stack0xffffffffffffffe0);
    std::__cxx11::string::append(*(char **)in_RDI,(ulong)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void AddFixed64(uint32 num, uint64 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 1, unknown_);
    char buffer[8];
    io::CodedOutputStream::WriteLittleEndian64ToArray(
        value, reinterpret_cast<uint8*>(buffer));
    unknown_->append(buffer, 8);
  }